

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

_Bool run_container_is_subset(run_container_t *container1,run_container_t *container2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int stop2;
  int start2;
  int stop1;
  int start1;
  int i2;
  int i1;
  run_container_t *container2_local;
  run_container_t *container1_local;
  
  i1 = 0;
  i2 = 0;
  while( true ) {
    bVar1 = false;
    if (i1 < container1->n_runs) {
      bVar1 = i2 < container2->n_runs;
    }
    if (!bVar1) break;
    uVar2 = (uint)container1->runs[i1].value;
    uVar3 = uVar2 + container1->runs[i1].length;
    uVar4 = (uint)container2->runs[i2].value;
    uVar5 = uVar4 + container2->runs[i2].length;
    if (uVar2 < uVar4) {
      return false;
    }
    if (uVar3 < uVar5) {
      i1 = i1 + 1;
    }
    else {
      if (uVar3 == uVar5) {
        i1 = i1 + 1;
      }
      i2 = i2 + 1;
    }
  }
  if (i1 == container1->n_runs) {
    return true;
  }
  return false;
}

Assistant:

bool run_container_is_subset(const run_container_t *container1,
                             const run_container_t *container2) {
    int i1 = 0, i2 = 0;
    while (i1 < container1->n_runs && i2 < container2->n_runs) {
        int start1 = container1->runs[i1].value;
        int stop1 = start1 + container1->runs[i1].length;
        int start2 = container2->runs[i2].value;
        int stop2 = start2 + container2->runs[i2].length;
        if (start1 < start2) {
            return false;
        } else {  // start1 >= start2
            if (stop1 < stop2) {
                i1++;
            } else if (stop1 == stop2) {
                i1++;
                i2++;
            } else {  // stop1 > stop2
                i2++;
            }
        }
    }
    if (i1 == container1->n_runs) {
        return true;
    } else {
        return false;
    }
}